

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O0

void spell_diffusion(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  undefined2 uVar2;
  long in_RCX;
  long in_RDX;
  int in_ESI;
  undefined2 in_DI;
  AFFECT_DATA af;
  CHAR_DATA *victim;
  void *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  CHAR_DATA *in_stack_ffffffffffffff78;
  CHAR_DATA *ch_00;
  char *in_stack_ffffffffffffff80;
  undefined2 in_stack_ffffffffffffff88;
  undefined2 uVar3;
  undefined2 uVar4;
  undefined2 uVar5;
  undefined2 uVar6;
  
  bVar1 = is_affected_by(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74);
  if (bVar1) {
    if (in_RCX == in_RDX) {
      send_to_char(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    }
    else {
      send_to_char(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    }
  }
  else {
    init_affect((AFFECT_DATA *)0x6dbad8);
    uVar3 = 0;
    uVar2 = (undefined2)in_ESI;
    uVar4 = (undefined2)(in_ESI / 3);
    uVar5 = 0;
    uVar6 = 0;
    std::pow<int,int>(0,0x6dbb30);
    ch_00 = (CHAR_DATA *)0x0;
    act(in_stack_ffffffffffffff80,(CHAR_DATA *)0x0,
        (void *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
        in_stack_ffffffffffffff68,0);
    act(in_stack_ffffffffffffff80,ch_00,
        (void *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
        in_stack_ffffffffffffff68,0);
    new_affect_to_char((CHAR_DATA *)CONCAT26(6,CONCAT24(uVar6,CONCAT22(uVar5,uVar4))),
                       (AFFECT_DATA *)
                       CONCAT26(uVar2,CONCAT24(in_DI,CONCAT22(uVar3,in_stack_ffffffffffffff88))));
    if (in_RDX != in_RCX) {
      send_to_char(in_stack_ffffffffffffff80,ch_00);
    }
  }
  return;
}

Assistant:

void spell_diffusion(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	AFFECT_DATA af;

	if (!is_affected_by(victim, AFF_PASS_DOOR))
	{
		init_affect(&af);
		af.where = TO_AFFECTS;
		af.type = sn;
		af.aftype = AFT_SPELL;
		af.level = level;
		af.duration = level / 3;
		af.location = 0;
		af.modifier = 0;

		SET_BIT(af.bitvector, AFF_PASS_DOOR);

		af.owner = nullptr;
		af.end_fun = nullptr;

		act("An odd tingling washes over you as your density is decreased to the point of translucence.", victim, nullptr, nullptr, TO_CHAR);
		act("$n's body seems to stretch slightly as $e becomes translucent!", victim, nullptr, nullptr, TO_ROOM);

		af.mod_name = MOD_PHASE;
		new_affect_to_char(victim, &af);

		if (ch != victim)
			send_to_char("Ok.\n\r", ch);
	}
	else
	{
		if (victim == ch)
			send_to_char("You are already translucent.\n\r", ch);
		else
			send_to_char("They are already translucent.\n\r", ch);
	}
}